

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarchingCube.cpp
# Opt level: O2

double __thiscall
MarchingCube::interp(MarchingCube *this,Field<double,_unsigned_short> *F,double x,double y,double z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  unsigned_short i;
  unsigned_short k;
  unsigned_short j;
  unsigned_short i_00;
  double *pdVar7;
  unsigned_short k_00;
  unsigned_short j_00;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  if ((((x < 0.0) || (y < 0.0)) || (z < 0.0)) ||
     ((((double)(int)(F->_Xsize - 1) < x || ((double)(int)(F->_Ysize - 1) < y)) ||
      ((double)(int)(F->_Zsize - 1) < z)))) {
    dVar8 = 65536.0;
  }
  else {
    i_00 = (unsigned_short)(int)x;
    i = i_00 + 1;
    j = (unsigned_short)(int)y;
    j_00 = j + 1;
    k = (unsigned_short)(int)z;
    k_00 = k + 1;
    dVar9 = x - (double)((int)x & 0xffff);
    dVar10 = y - (double)((int)y & 0xffff);
    dVar11 = z - (double)((int)z & 0xffff);
    dVar12 = 1.0 - dVar11;
    pdVar7 = Field<double,_unsigned_short>::operator()(F,i_00,j,k);
    dVar8 = *pdVar7;
    pdVar7 = Field<double,_unsigned_short>::operator()(F,i_00,j,k_00);
    dVar1 = *pdVar7;
    pdVar7 = Field<double,_unsigned_short>::operator()(F,i_00,j_00,k);
    dVar2 = *pdVar7;
    pdVar7 = Field<double,_unsigned_short>::operator()(F,i_00,j_00,k_00);
    dVar3 = *pdVar7;
    pdVar7 = Field<double,_unsigned_short>::operator()(F,i,j,k);
    dVar4 = *pdVar7;
    pdVar7 = Field<double,_unsigned_short>::operator()(F,i,j,k_00);
    dVar5 = *pdVar7;
    pdVar7 = Field<double,_unsigned_short>::operator()(F,i,j_00,k);
    dVar6 = *pdVar7;
    pdVar7 = Field<double,_unsigned_short>::operator()(F,i,j_00,k_00);
    dVar8 = ((dVar5 * dVar11 + dVar4 * dVar12) * (1.0 - dVar10) +
            (dVar11 * *pdVar7 + dVar12 * dVar6) * dVar10) * dVar9 +
            ((dVar1 * dVar11 + dVar8 * dVar12) * (1.0 - dVar10) +
            (dVar3 * dVar11 + dVar2 * dVar12) * dVar10) * (1.0 - dVar9);
  }
  return dVar8;
}

Assistant:

inline double MarchingCube::interp(
        const Field<double, std::uint16_t>& F,
        const double x,
        const double y,
        const double z
    ) const
{
    // Outside of the simulation cube positive to build triangle around the mesh
    if (x < 0 || y < 0 || z < 0 || x > F.x()-1 || y > F.y()-1 || z > F.z()-1)
    {
        return 65536;
    }
    const std::uint16_t i0 = static_cast<std::uint16_t>(x);
    const std::uint16_t i1 = i0 + 1;
    const std::uint16_t j0 = static_cast<std::uint16_t>(y);
    const std::uint16_t j1 = j0 + 1;
    const std::uint16_t k0 = static_cast<std::uint16_t>(z);
    const std::uint16_t k1 = k0 + 1;

    const double s1 = x - i0;
    const double s0 = 1.0 - s1;
    const double t1 = y - j0;
    const double t0 = 1.0 - t1;
    const double u1 = z - k0;
    const double u0 = 1.0 - u1;

    return s0 * (     t0 * ( u0 * F(i0, j0, k0) + u1 * F(i0, j0, k1) )
                    + t1 * ( u0 * F(i0, j1, k0) + u1 * F(i0, j1, k1) )
                    )
         + s1 * (     t0 * ( u0 * F(i1, j0, k0) + u1 * F(i1, j0, k1) )
                    + t1 * ( u0 * F(i1, j1, k0) + u1 * F(i1, j1, k1) )
                );
}